

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O0

void __thiscall
embree::ParallelRadixSort<unsigned_long,_unsigned_long>::tbbRadixSort
          (ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
           *this,size_t numTasks)

{
  void *pvVar1;
  size_t in_RSI;
  undefined8 *in_RDI;
  size_t in_stack_000000a8;
  unsigned_long *in_stack_000000b0;
  unsigned_long *in_stack_000000b8;
  bool in_stack_000000c7;
  unsigned_long in_stack_000000c8;
  ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
  *in_stack_000000d0;
  
  pvVar1 = alignedMalloc((size_t)in_RDI,in_RSI);
  *in_RDI = pvVar1;
  tbbRadixIteration(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000b8,
                    in_stack_000000b0,in_stack_000000a8);
  tbbRadixIteration(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000b8,
                    in_stack_000000b0,in_stack_000000a8);
  tbbRadixIteration(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000b8,
                    in_stack_000000b0,in_stack_000000a8);
  tbbRadixIteration(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000b8,
                    in_stack_000000b0,in_stack_000000a8);
  tbbRadixIteration(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000b8,
                    in_stack_000000b0,in_stack_000000a8);
  tbbRadixIteration(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000b8,
                    in_stack_000000b0,in_stack_000000a8);
  tbbRadixIteration(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000b8,
                    in_stack_000000b0,in_stack_000000a8);
  tbbRadixIteration(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000b8,
                    in_stack_000000b0,in_stack_000000a8);
  return;
}

Assistant:

void tbbRadixSort(const size_t numTasks)
    {
      radixCount = (TyRadixCount*) alignedMalloc(MAX_TASKS*sizeof(TyRadixCount),64);
      
      if (sizeof(Key) == sizeof(uint32_t)) {
        tbbRadixIteration(0*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(1*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(2*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(3*BITS,1,tmp,src,numTasks);
      }
      else if (sizeof(Key) == sizeof(uint64_t))
      {
        tbbRadixIteration(0*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(1*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(2*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(3*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(4*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(5*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(6*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(7*BITS,1,tmp,src,numTasks);
      }
    }